

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

Status __thiscall
leveldb::log::LogTest::StringSource::Read(StringSource *this,size_t n,Slice *result,char *scratch)

{
  Tester *this_00;
  Slice local_1d0;
  Tester local_1c0;
  
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0.line_ = 0xb4;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1c0 + 0x18));
  this_00 = test::Tester::Is(&local_1c0,(bool)(*(byte *)(n + 0x19) ^ 1),"!returned_partial_");
  test::Tester::operator<<(this_00,(char (*) [32])"must not Read() after eof/error");
  test::Tester::~Tester(&local_1c0);
  if (*(char *)(n + 0x18) == '\x01') {
    *(undefined2 *)(n + 0x18) = 0x100;
    local_1c0._0_8_ = "read error";
    local_1c0.fname_ = (char *)0xa;
    local_1d0.data_ = "";
    local_1d0.size_ = 0;
    Status::Status((Status *)this,kCorruption,(Slice *)&local_1c0,&local_1d0);
  }
  else {
    if (*(Slice **)(n + 0x10) < result) {
      *(undefined1 *)(n + 0x19) = 1;
      result = *(Slice **)(n + 0x10);
    }
    *(undefined8 *)scratch = *(undefined8 *)(n + 8);
    *(Slice **)(scratch + 8) = result;
    if (*(Slice **)(n + 0x10) < result) {
      __assert_fail("n <= size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/include/leveldb/slice.h"
                    ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
    }
    *(long *)(n + 8) = (long)&result->data_ + *(long *)(n + 8);
    *(long *)(n + 0x10) = (long)*(Slice **)(n + 0x10) - (long)result;
    (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
      ASSERT_TRUE(!returned_partial_) << "must not Read() after eof/error";

      if (force_error_) {
        force_error_ = false;
        returned_partial_ = true;
        return Status::Corruption("read error");
      }

      if (contents_.size() < n) {
        n = contents_.size();
        returned_partial_ = true;
      }
      *result = Slice(contents_.data(), n);
      contents_.remove_prefix(n);
      return Status::OK();
    }